

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::OptTagChecks(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  _func_int **pp_Var2;
  Sym *pSVar3;
  code *pcVar4;
  anon_class_32_4_be7ea101 fn;
  bool bVar5;
  OpndKind OVar6;
  ValueType VVar7;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar8;
  Value *pVVar9;
  undefined6 extraout_var;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  Instr *this_02;
  Instr *sym;
  Opnd *this_03;
  Instr *pIVar10;
  Value *local_70;
  Value *value;
  Instr *bailOutInstr;
  Instr *local_58;
  undefined4 local_4c;
  Instr *local_48;
  Opnd *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,OptTagChecksPhase,sourceContextId,functionId);
  if (bVar5) {
    return false;
  }
  if ((this->field_0xf7 & 4) == 0) {
    return false;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < BailOnNotObject) {
    if ((OVar1 == LdFld) || (OVar1 == LdMethodFld)) goto LAB_0044be00;
    if (OVar1 != StFld) {
      return false;
    }
    this_03 = instr->m_dst;
LAB_0044be04:
    OVar6 = IR::Opnd::GetKind(this_03);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_0044c190;
      *puVar8 = 0;
    }
    pp_Var2 = this_03[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var2 + 0x14) != '\x02') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar5) goto LAB_0044c190;
      *puVar8 = 0;
    }
    sym = (Instr *)pp_Var2[4];
    pIVar10 = (Instr *)0x0;
  }
  else {
    if (CallIFixed < OVar1) {
      if ((OVar1 != CheckPropertyGuardAndLoadType) && (OVar1 != CheckFixedFld)) {
        return false;
      }
LAB_0044be00:
      this_03 = instr->m_src1;
      goto LAB_0044be04;
    }
    if ((OVar1 != BailOnNotObject) && (OVar1 != BailOnNotArray)) {
      return false;
    }
    OVar6 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar6 != OpndKindReg) {
      return false;
    }
    pIVar10 = (Instr *)instr->m_src1;
    OVar6 = IR::Opnd::GetKind((Opnd *)pIVar10);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_0044c190;
      *puVar8 = 0;
    }
    sym = pIVar10->m_next;
    this_03 = (Opnd *)0x0;
  }
  if ((sym != (Instr *)0x0) &&
     (bailOutInstr = pIVar10, local_48 = sym,
     pVVar9 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)sym),
     pVVar9 != (Value *)0x0)) {
    pSVar3 = pVVar9->valueInfo->symStore;
    if ((pSVar3 == (Sym *)0x0) ||
       ((pSVar3->m_kind != SymKindStack || (((ulong)pSVar3[1]._vptr_Sym & 0x40000) == 0)))) {
      local_32[0] = (pVVar9->valueInfo->super_ValueType).field_0;
      OVar1 = instr->m_opcode;
      local_70 = pVVar9;
      local_58 = instr;
      local_40 = this_03;
      bVar5 = ValueType::CanBeTaggedValue((ValueType *)&local_32[0].field_0);
      pIVar10 = local_58;
      if (OVar1 == BailOnNotObject) {
        if (bVar5) {
          VVar7 = ValueType::SetCanBeTaggedValue((ValueType *)&local_32[0].field_0,false);
          ChangeValueType(this,(BasicBlock *)0x0,pVVar9,VVar7,true,false);
        }
        else if (this->prePassLoop == (Loop *)0x0) {
          if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            InsertByteCodeUses(this,local_58,false);
          }
          BasicBlock::RemoveInstr(this->currentBlock,pIVar10);
        }
        return !bVar5;
      }
      if (((bVar5) && (bVar5 = ValueType::HasBeenNumber((ValueType *)&local_32[0].field_0), !bVar5))
         && (this->prePassLoop == (Loop *)0x0)) {
        VVar7 = ValueType::SetCanBeTaggedValue((ValueType *)&local_32[0].field_0,false);
        pIVar10 = local_58;
        local_4c = (undefined4)CONCAT62(extraout_var,VVar7.field_0);
        instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                             (BailOnNotObject,BailOutOnTaggedValue,local_58,local_58->m_func);
        value = (Value *)instr_00;
        if (this->prePassLoop == (Loop *)0x0) {
          FillBailOutInfo(this,this->currentBlock,&instr_00->super_Instr);
        }
        this_02 = bailOutInstr;
        if (bailOutInstr == (Instr *)0x0) {
          this_02 = (Instr *)IR::RegOpnd::New((StackSym *)sym,*(IRType *)((long)&sym->m_prev + 4),
                                              pIVar10->m_func);
          if (local_40 == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xb84,"(symOpnd)","symOpnd");
            if (!bVar5) {
LAB_0044c190:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar8 = 0;
          }
          if ((local_40->field_0xb & 8) != 0) {
            IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_02,true);
          }
        }
        IR::Instr::SetSrc1(&instr_00->super_Instr,(Opnd *)this_02);
        pVVar9 = value;
        IR::Opnd::SetValueType((Opnd *)value[4].valueInfo,(ValueType)local_32[0].field_0);
        IR::Instr::SetByteCodeOffset((Instr *)pVVar9,pIVar10);
        IR::Instr::InsertBefore(pIVar10,(Instr *)pVVar9);
        if (this->currentBlock->loop != (Loop *)0x0) {
          fn.bailOutInstr = (Instr **)&value;
          fn.this = this;
          fn.value = &local_70;
          fn.stackSym = (StackSym **)&local_48;
          TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::OptTagChecks(IR::Instr*)::__0>
                    (this,(Instr *)pVVar9,fn);
        }
        VVar7.field_0 = SUB42(local_4c,0);
        if (local_40 == (Opnd *)0x0) {
          IR::Opnd::SetValueType((Opnd *)bailOutInstr,VVar7);
        }
        else {
          *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&local_40[1].m_kind =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               VVar7.field_0;
        }
        ChangeValueType(this,(BasicBlock *)0x0,local_70,VVar7,false,false);
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::OptTagChecks(IR::Instr *instr)
{
    if (PHASE_OFF(Js::OptTagChecksPhase, this->func) || !this->DoTagChecks())
    {
        return false;
    }

    StackSym *stackSym = nullptr;
    IR::SymOpnd *symOpnd = nullptr;
    IR::RegOpnd *regOpnd = nullptr;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::CheckFixedFld:
    case Js::OpCode::CheckPropertyGuardAndLoadType:
        symOpnd = instr->GetSrc1()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;

    case Js::OpCode::BailOnNotObject:
    case Js::OpCode::BailOnNotArray:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            regOpnd = instr->GetSrc1()->AsRegOpnd();
            stackSym = regOpnd->m_sym;
        }
        break;

    case Js::OpCode::StFld:
        symOpnd = instr->GetDst()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;
    }

    if (stackSym)
    {
        Value *value = CurrentBlockData()->FindValue(stackSym);
        if (value)
        {
            ValueInfo *valInfo = value->GetValueInfo();
            if (valInfo->GetSymStore() && valInfo->GetSymStore()->IsStackSym() && valInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
            {
                return false;
            }
            ValueType valueType = value->GetValueInfo()->Type();
            if (instr->m_opcode == Js::OpCode::BailOnNotObject)
            {
                if (valueType.CanBeTaggedValue())
                {
                    // We're not adding new information to the value other than changing the value type. Preserve any existing
                    // information and just change the value type.
                    ChangeValueType(nullptr, value, valueType.SetCanBeTaggedValue(false), true /*preserveSubClassInfo*/);
                    return false;
                }
                if (!this->IsLoopPrePass())
                {
                    if (this->byteCodeUses)
                    {
                        this->InsertByteCodeUses(instr);
                    }
                    this->currentBlock->RemoveInstr(instr);
                }
                return true;
            }

            if (valueType.CanBeTaggedValue() &&
                !valueType.HasBeenNumber() &&
                !this->IsLoopPrePass())
            {
                ValueType newValueType = valueType.SetCanBeTaggedValue(false);

                // Split out the tag check as a separate instruction.
                IR::Instr *bailOutInstr;
                bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, IR::BailOutOnTaggedValue, instr, instr->m_func);
                if (!this->IsLoopPrePass())
                {
                    FillBailOutInfo(this->currentBlock, bailOutInstr);
                }
                IR::RegOpnd *srcOpnd = regOpnd;
                if (!srcOpnd)
                {
                    srcOpnd = IR::RegOpnd::New(stackSym, stackSym->GetType(), instr->m_func);
                    AnalysisAssert(symOpnd);
                    if (symOpnd->GetIsJITOptimizedReg())
                    {
                        srcOpnd->SetIsJITOptimizedReg(true);
                    }
                }
                bailOutInstr->SetSrc1(srcOpnd);
                bailOutInstr->GetSrc1()->SetValueType(valueType);
                bailOutInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(bailOutInstr);
                if (this->currentBlock->loop)
                {
                    // Try hoisting the BailOnNotObject instr.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(bailOutInstr, [&]()
                    {
                        if (TryHoistInvariant(bailOutInstr, this->currentBlock, nullptr, value, nullptr, true, false, false, IR::BailOutOnTaggedValue))
                        {
                            Value* landingPadValue = this->currentBlock->loop->landingPad->globOptData.FindValue(stackSym);
                            ValueType newLandingPadValueType = landingPadValue->GetValueInfo()->Type().SetCanBeTaggedValue(false);
                            ChangeValueType(nullptr, landingPadValue, newLandingPadValueType, false);
                        }
                    });
                }
                if (symOpnd)
                {
                    symOpnd->SetPropertyOwnerValueType(newValueType);
                }
                else
                {
                    regOpnd->SetValueType(newValueType);
                }
                ChangeValueType(nullptr, value, newValueType, false);
            }
        }
    }

    return false;
}